

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_setup_skip_mode_allowed(AV1_COMMON *cm)

{
  uint uVar1;
  uint a;
  int iVar2;
  OrderHintInfo *oh;
  SkipModeInfo *pSVar3;
  RefCntBuffer *pRVar4;
  AV1_COMMON *in_RDI;
  int ref_order_hint_1;
  RefCntBuffer *buf_1;
  int i_1;
  int ref_order_hint;
  RefCntBuffer *buf;
  int i;
  int ref_idx [2];
  int ref_order_hints [2];
  int cur_order_hint;
  SkipModeInfo *skip_mode_info;
  OrderHintInfo *order_hint_info;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  int local_50;
  int local_40;
  int local_30;
  undefined8 local_2c;
  undefined8 local_24;
  
  oh = &in_RDI->seq_params->order_hint_info;
  pSVar3 = &(in_RDI->current_frame).skip_mode_info;
  pSVar3->skip_mode_allowed = 0;
  (in_RDI->current_frame).skip_mode_info.ref_frame_idx_0 = -1;
  (in_RDI->current_frame).skip_mode_info.ref_frame_idx_1 = -1;
  if (((oh->enable_order_hint != 0) && (iVar2 = frame_is_intra_only(in_RDI), iVar2 == 0)) &&
     ((in_RDI->current_frame).reference_mode != '\0')) {
    uVar1 = (in_RDI->current_frame).order_hint;
    local_24 = 0x7fffffffffffffff;
    local_2c = 0xffffffffffffffff;
    local_30 = 0;
    while( true ) {
      if (6 < local_30) break;
      pRVar4 = get_ref_frame_buf((AV1_COMMON *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9f);
      if (pRVar4 != (RefCntBuffer *)0x0) {
        a = pRVar4->order_hint;
        iVar2 = get_relative_dist(oh,a,uVar1);
        if (iVar2 < 0) {
          if (((int)local_24 == -1) || (iVar2 = get_relative_dist(oh,a,(int)local_24), 0 < iVar2)) {
            local_24 = CONCAT44(local_24._4_4_,a);
            local_2c = CONCAT44(local_2c._4_4_,local_30);
          }
        }
        else {
          iVar2 = get_relative_dist(oh,a,uVar1);
          if ((0 < iVar2) &&
             ((local_24._4_4_ == 0x7fffffff ||
              (iVar2 = get_relative_dist(oh,a,local_24._4_4_), iVar2 < 0)))) {
            local_24 = CONCAT44(a,(int)local_24);
            local_2c = CONCAT44(local_30,(int)local_2c);
          }
        }
      }
      local_30 = local_30 + 1;
    }
    if (((int)local_2c == -1) || (local_2c._4_4_ == -1)) {
      if (((int)local_2c != -1) && (local_2c._4_4_ == -1)) {
        local_24._4_4_ = 0xffffffff;
        for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
          pRVar4 = get_ref_frame_buf((AV1_COMMON *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                     in_stack_ffffffffffffff9f);
          if ((((pRVar4 != (RefCntBuffer *)0x0) && (uVar1 = pRVar4->order_hint, (int)local_24 != -1)
               ) && (iVar2 = get_relative_dist(oh,uVar1,(int)local_24), iVar2 < 0)) &&
             ((local_24._4_4_ == 0xffffffff ||
              (iVar2 = get_relative_dist(oh,uVar1,local_24._4_4_), 0 < iVar2)))) {
            local_2c = CONCAT44(local_40,(int)local_2c);
            local_24._4_4_ = uVar1;
          }
        }
        if (local_24._4_4_ != 0xffffffff) {
          pSVar3->skip_mode_allowed = 1;
          if ((int)local_2c < local_2c._4_4_) {
            local_58 = (int)local_2c;
          }
          else {
            local_58 = local_2c._4_4_;
          }
          (in_RDI->current_frame).skip_mode_info.ref_frame_idx_0 = local_58;
          if (local_2c._4_4_ < (int)local_2c) {
            local_2c._4_4_ = (int)local_2c;
          }
          (in_RDI->current_frame).skip_mode_info.ref_frame_idx_1 = local_2c._4_4_;
        }
      }
    }
    else {
      pSVar3->skip_mode_allowed = 1;
      if ((int)local_2c < local_2c._4_4_) {
        local_50 = (int)local_2c;
      }
      else {
        local_50 = local_2c._4_4_;
      }
      (in_RDI->current_frame).skip_mode_info.ref_frame_idx_0 = local_50;
      if (local_2c._4_4_ < (int)local_2c) {
        local_54 = (int)local_2c;
      }
      else {
        local_54 = local_2c._4_4_;
      }
      (in_RDI->current_frame).skip_mode_info.ref_frame_idx_1 = local_54;
    }
  }
  return;
}

Assistant:

void av1_setup_skip_mode_allowed(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;
  SkipModeInfo *const skip_mode_info = &cm->current_frame.skip_mode_info;

  skip_mode_info->skip_mode_allowed = 0;
  skip_mode_info->ref_frame_idx_0 = INVALID_IDX;
  skip_mode_info->ref_frame_idx_1 = INVALID_IDX;

  if (!order_hint_info->enable_order_hint || frame_is_intra_only(cm) ||
      cm->current_frame.reference_mode == SINGLE_REFERENCE)
    return;

  const int cur_order_hint = cm->current_frame.order_hint;
  int ref_order_hints[2] = { -1, INT_MAX };
  int ref_idx[2] = { INVALID_IDX, INVALID_IDX };

  // Identify the nearest forward and backward references.
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, LAST_FRAME + i);
    if (buf == NULL) continue;

    const int ref_order_hint = buf->order_hint;
    if (get_relative_dist(order_hint_info, ref_order_hint, cur_order_hint) <
        0) {
      // Forward reference
      if (ref_order_hints[0] == -1 ||
          get_relative_dist(order_hint_info, ref_order_hint,
                            ref_order_hints[0]) > 0) {
        ref_order_hints[0] = ref_order_hint;
        ref_idx[0] = i;
      }
    } else if (get_relative_dist(order_hint_info, ref_order_hint,
                                 cur_order_hint) > 0) {
      // Backward reference
      if (ref_order_hints[1] == INT_MAX ||
          get_relative_dist(order_hint_info, ref_order_hint,
                            ref_order_hints[1]) < 0) {
        ref_order_hints[1] = ref_order_hint;
        ref_idx[1] = i;
      }
    }
  }

  if (ref_idx[0] != INVALID_IDX && ref_idx[1] != INVALID_IDX) {
    // == Bi-directional prediction ==
    skip_mode_info->skip_mode_allowed = 1;
    skip_mode_info->ref_frame_idx_0 = AOMMIN(ref_idx[0], ref_idx[1]);
    skip_mode_info->ref_frame_idx_1 = AOMMAX(ref_idx[0], ref_idx[1]);
  } else if (ref_idx[0] != INVALID_IDX && ref_idx[1] == INVALID_IDX) {
    // == Forward prediction only ==
    // Identify the second nearest forward reference.
    ref_order_hints[1] = -1;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      const RefCntBuffer *const buf = get_ref_frame_buf(cm, LAST_FRAME + i);
      if (buf == NULL) continue;

      const int ref_order_hint = buf->order_hint;
      if ((ref_order_hints[0] != -1 &&
           get_relative_dist(order_hint_info, ref_order_hint,
                             ref_order_hints[0]) < 0) &&
          (ref_order_hints[1] == -1 ||
           get_relative_dist(order_hint_info, ref_order_hint,
                             ref_order_hints[1]) > 0)) {
        // Second closest forward reference
        ref_order_hints[1] = ref_order_hint;
        ref_idx[1] = i;
      }
    }
    if (ref_order_hints[1] != -1) {
      skip_mode_info->skip_mode_allowed = 1;
      skip_mode_info->ref_frame_idx_0 = AOMMIN(ref_idx[0], ref_idx[1]);
      skip_mode_info->ref_frame_idx_1 = AOMMAX(ref_idx[0], ref_idx[1]);
    }
  }
}